

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

Instruction * __thiscall
spirv_cross::CompilerGLSL::get_next_instruction_in_block(CompilerGLSL *this,Instruction *instr)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  ulong uVar3;
  
  pIVar1 = (this->current_emitting_block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
  uVar3 = (ulong)((int)((ulong)((long)instr - (long)pIVar1) >> 2) * -0x55555555 + 1);
  pIVar2 = (Instruction *)0x0;
  if (uVar3 < (this->current_emitting_block->ops).super_VectorView<spirv_cross::Instruction>.
              buffer_size) {
    pIVar2 = pIVar1 + uVar3;
  }
  return pIVar2;
}

Assistant:

const Instruction *CompilerGLSL::get_next_instruction_in_block(const Instruction &instr)
{
	// FIXME: This is kind of hacky. There should be a cleaner way.
	auto offset = uint32_t(&instr - current_emitting_block->ops.data());
	if ((offset + 1) < current_emitting_block->ops.size())
		return &current_emitting_block->ops[offset + 1];
	else
		return nullptr;
}